

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

void polynomial_formal_derivative(field_t field,polynomial_t poly,polynomial_t der)

{
  field_t field_00;
  field_element_t fVar1;
  long in_RDX;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  void *in_R8;
  uint in_R9D;
  uint i;
  undefined4 local_34;
  
  memset(in_R8,0,(ulong)(in_R9D + 1));
  for (local_34 = 0; local_34 <= in_R9D; local_34 = local_34 + 1) {
    field_00.log = in_RSI;
    field_00.exp = in_RDI;
    fVar1 = field_sum(field_00,*(field_element_t *)(in_RDX + (ulong)(local_34 + 1)),local_34 + 1);
    *(field_element_t *)((long)in_R8 + (ulong)local_34) = fVar1;
  }
  return;
}

Assistant:

void polynomial_formal_derivative(field_t field, polynomial_t poly, polynomial_t der) {
    // if f(x) = a(n)*x^n + ... + a(1)*x + a(0)
    // then f'(x) = n*a(n)*x^(n-1) + ... + 2*a(2)*x + a(1)
    // where n*a(n) = sum(k=1, n, a(n)) e.g. the nth sum of a(n) in GF(2^8)

    // assumes der.order = poly.order - 1
    memset(der.coeff, 0, sizeof(field_element_t) * (der.order + 1));
    for (unsigned int i = 0; i <= der.order; i++) {
        // we're filling in the ith power of der, so we look ahead one power in poly
        // f(x) = a(i + 1)*x^(i + 1) -> f'(x) = (i + 1)*a(i + 1)*x^i
        // where (i + 1)*a(i + 1) is the sum of a(i + 1) (i + 1) times, not the product
        der.coeff[i] = field_sum(field, poly.coeff[i + 1], i + 1);
    }
}